

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPMS_ATTEST_Marshal(TPMS_ATTEST *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  UINT16 UVar2;
  UINT16 UVar3;
  UINT16 UVar4;
  UINT16 UVar5;
  UINT16 UVar6;
  UINT16 UVar7;
  UINT16 result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_ATTEST *source_local;
  
  UVar1 = UINT32_Marshal(&source->magic,buffer,size);
  UVar2 = UINT16_Marshal(&source->type,buffer,size);
  UVar3 = TPM2B_NAME_Marshal(&source->qualifiedSigner,buffer,size);
  UVar4 = TPM2B_DATA_Marshal(&source->extraData,buffer,size);
  UVar5 = TPMS_CLOCK_INFO_Marshal(&source->clockInfo,buffer,size);
  UVar6 = UINT64_Marshal(&source->firmwareVersion,buffer,size);
  UVar7 = TPMU_ATTEST_Marshal(&source->attested,buffer,size,(uint)source->type);
  return UVar1 + UVar2 + UVar3 + UVar4 + UVar5 + UVar6 + UVar7;
}

Assistant:

UINT16
TPMS_ATTEST_Marshal(TPMS_ATTEST *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + TPM_GENERATED_Marshal((TPM_GENERATED *)&(source->magic), buffer, size));
    result = (UINT16)(result + TPMI_ST_ATTEST_Marshal((TPMI_ST_ATTEST *)&(source->type), buffer, size));
    result = (UINT16)(result + TPM2B_NAME_Marshal((TPM2B_NAME *)&(source->qualifiedSigner), buffer, size));
    result = (UINT16)(result + TPM2B_DATA_Marshal((TPM2B_DATA *)&(source->extraData), buffer, size));
    result = (UINT16)(result + TPMS_CLOCK_INFO_Marshal((TPMS_CLOCK_INFO *)&(source->clockInfo), buffer, size));
    result = (UINT16)(result + UINT64_Marshal((UINT64 *)&(source->firmwareVersion), buffer, size));
    result = (UINT16)(result + TPMU_ATTEST_Marshal((TPMU_ATTEST *)&(source->attested), buffer, size, (UINT32)source->type));
    return result;
}